

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O1

void slang::ast::CoverCrossSymbol::fromSyntax
               (Scope *scope,CoverCrossSyntax *syntax,
               SmallVectorBase<const_slang::ast::Symbol_*> *results)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *psVar1;
  Compilation *args;
  size_type sVar2;
  pointer ppMVar3;
  SyntaxNode *syntax_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  CoverCrossSyntax *pCVar4;
  pointer ppCVar5;
  int iVar6;
  IdentifierNameSyntax *syntax_02;
  CoverpointSymbol *pCVar7;
  undefined4 extraout_var;
  CoverCrossSymbol *this;
  CoverCrossBodySymbol *symbol;
  TypeAliasType *pTVar8;
  QueueType *pQVar9;
  CoverageOptionSyntax *syntax_03;
  undefined4 extraout_var_00;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  pointer extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *extraout_RDX_05;
  EVP_PKEY_CTX *pEVar10;
  size_type extraout_RDX_06;
  Token *this_00;
  Scope *scope_00;
  ulong uVar11;
  long lVar12;
  size_t index;
  long lVar13;
  string_view name;
  LookupLocation lookupLocation;
  SmallVector<const_slang::ast::CoverpointSymbol_*,_5UL> targets;
  StructBuilder valType;
  OptionBuilder options;
  SourceLocation local_2b0;
  CoverCrossSyntax *local_2a8;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_2a0;
  string_view local_298;
  CoverCrossSymbol *local_288;
  CoverCrossBodySymbol *local_280;
  Scope *local_278;
  SmallVectorBase<const_slang::ast::CoverpointSymbol_*> local_270 [2];
  CoverCrossSymbol *local_230;
  StructBuilder local_228;
  OptionBuilder local_210;
  
  local_298 = (string_view)ZEXT816(0);
  local_2b0 = (SourceLocation)0x0;
  local_2a0 = results;
  if (syntax->label == (NamedLabelSyntax *)0x0) {
    this_00 = &syntax->cross;
  }
  else {
    local_298 = parsing::Token::valueText(&syntax->label->name);
    this_00 = &syntax->label->name;
  }
  local_2b0 = parsing::Token::location(this_00);
  local_270[0].data_ = (pointer)local_270[0].firstElement;
  local_270[0].len = 0;
  local_270[0].cap = 5;
  uVar11 = (syntax->items).elements.size_ + 1;
  pEVar10 = extraout_RDX;
  local_2a8 = syntax;
  if (1 < uVar11) {
    index = 0;
    do {
      syntax_02 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
                  operator[](&syntax->items,index);
      name = parsing::Token::valueText(&syntax_02->identifier);
      pCVar7 = (CoverpointSymbol *)Scope::find(scope,name);
      if ((pCVar7 == (CoverpointSymbol *)0x0) || ((pCVar7->super_Symbol).kind != Coverpoint)) {
        pCVar7 = CoverpointSymbol::fromImplicit(scope,syntax_02);
        local_210.scope = (Scope *)pCVar7;
        SmallVectorBase<slang::ast::CoverpointSymbol_const*>::
        emplace_back<slang::ast::CoverpointSymbol_const*>
                  ((SmallVectorBase<slang::ast::CoverpointSymbol_const*> *)local_270,
                   (CoverpointSymbol **)&local_210);
        local_210.scope = (Scope *)pCVar7;
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)local_2a0,(Symbol **)&local_210);
        pEVar10 = extraout_RDX_01;
      }
      else {
        if ((pCVar7->super_Symbol).kind != Coverpoint) {
          assert::assertFailed
                    ("T::isKind(kind)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                     ,0xc4,
                     "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::CoverpointSymbol]");
        }
        local_210.scope = (Scope *)pCVar7;
        SmallVectorBase<slang::ast::CoverpointSymbol_const*>::
        emplace_back<slang::ast::CoverpointSymbol_const*>
                  ((SmallVectorBase<slang::ast::CoverpointSymbol_const*> *)local_270,
                   (CoverpointSymbol **)&local_210);
        pEVar10 = extraout_RDX_00;
      }
      index = index + 1;
    } while (uVar11 >> 1 != index);
  }
  args = scope->compilation;
  iVar6 = SmallVectorBase<const_slang::ast::CoverpointSymbol_*>::copy
                    (local_270,(EVP_PKEY_CTX *)args,pEVar10);
  local_210.scope = (Scope *)CONCAT44(extraout_var,iVar6);
  local_210.options.super_SmallVectorBase<slang::ast::CoverageOptionSetter>.data_ = extraout_RDX_02;
  this = BumpAllocator::
         emplace<slang::ast::CoverCrossSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,nonstd::span_lite::span<slang::ast::CoverpointSymbol_const*,18446744073709551615ul>>
                   (&args->super_BumpAllocator,args,&local_298,&local_2b0,
                    (span<const_slang::ast::CoverpointSymbol_*,_18446744073709551615UL> *)&local_210
                   );
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)local_2a8;
  psVar1 = &(local_2a8->super_MemberSyntax).attributes.
            super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>;
  syntax_01.data_ = psVar1->data_;
  syntax_01.size_ = psVar1->size_;
  if ((local_2a8->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ == 0 ||
      psVar1->data_ != (pointer)0x0) {
    Symbol::setAttributes(&this->super_Symbol,scope,syntax_01);
    symbol = BumpAllocator::
             emplace<slang::ast::CoverCrossBodySymbol,slang::ast::Compilation&,slang::SourceLocation&>
                       (&args->super_BumpAllocator,args,&local_2b0);
    local_278 = &this->super_Scope;
    Scope::addMember(local_278,&symbol->super_Symbol);
    scope_00 = &symbol->super_Scope;
    lookupLocation._12_4_ = 0;
    lookupLocation.scope = (Scope *)0x0;
    lookupLocation.index = 0;
    local_288 = this;
    local_280 = symbol;
    StructBuilder::StructBuilder(&local_228,scope_00,lookupLocation);
    ppCVar5 = local_270[0].data_;
    if (local_270[0].len != 0) {
      lVar12 = local_270[0].len << 3;
      lVar13 = 0;
      do {
        StructBuilder::addField
                  (&local_228,*(string_view *)(*(long *)((long)ppCVar5 + lVar13) + 8),
                   (DeclaredType *)(*(long *)((long)ppCVar5 + lVar13) + 0x70),
                   (bitmask<slang::ast::VariableFlags>)0x0);
        lVar13 = lVar13 + 8;
      } while (lVar12 != lVar13);
    }
    pTVar8 = BumpAllocator::
             emplace<slang::ast::TypeAliasType,char_const(&)[13],slang::SourceLocation&>
                       (&args->super_BumpAllocator,(char (*) [13])"CrossValType",&local_2b0);
    (pTVar8->targetType).type = &(local_228.type)->super_Type;
    Scope::addMember(scope_00,(Symbol *)pTVar8);
    local_210.scope = (Scope *)((ulong)local_210.scope & 0xffffffff00000000);
    pQVar9 = BumpAllocator::emplace<slang::ast::QueueType,slang::ast::TypeAliasType&,unsigned_int>
                       (&args->super_BumpAllocator,pTVar8,(uint *)&local_210);
    pCVar4 = local_2a8;
    pTVar8 = BumpAllocator::
             emplace<slang::ast::TypeAliasType,char_const(&)[15],slang::SourceLocation&>
                       (&args->super_BumpAllocator,(char (*) [15])"CrossQueueType",&local_2b0);
    (pTVar8->targetType).type = &pQVar9->super_Type;
    Scope::addMember(scope_00,(Symbol *)pTVar8);
    local_280->crossQueueType = &pTVar8->super_Type;
    anon_unknown.dwarf_13b6a18::OptionBuilder::OptionBuilder(&local_210,local_278);
    sVar2 = (pCVar4->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
            size_;
    pEVar10 = extraout_RDX_03;
    if (sVar2 != 0) {
      ppMVar3 = (pCVar4->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
                data_;
      lVar12 = 0;
      do {
        syntax_00 = *(SyntaxNode **)((long)ppMVar3 + lVar12);
        if (syntax_00->kind == CoverageOption) {
          syntax_03 = slang::syntax::SyntaxNode::as<slang::syntax::CoverageOptionSyntax>(syntax_00);
          anon_unknown.dwarf_13b6a18::OptionBuilder::add(&local_210,syntax_03);
          pEVar10 = extraout_RDX_04;
        }
        else {
          Scope::addMembers(scope_00,syntax_00);
          pEVar10 = extraout_RDX_05;
        }
        lVar12 = lVar12 + 8;
      } while (sVar2 << 3 != lVar12);
    }
    iVar6 = SmallVectorBase<slang::ast::CoverageOptionSetter>::copy
                      (&local_210.options.super_SmallVectorBase<slang::ast::CoverageOptionSetter>,
                       (EVP_PKEY_CTX *)(local_210.scope)->compilation,pEVar10);
    (local_288->options).data_ = (pointer)CONCAT44(extraout_var_00,iVar6);
    (local_288->options).size_ = extraout_RDX_06;
    local_230 = local_288;
    SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
              ((SmallVectorBase<slang::ast::Symbol_const*> *)local_2a0,(Symbol **)&local_230);
    ska::detailv3::
    sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>_>
    ::~sherwood_v3_table
              (&local_210.typeNames.
                super_flat_hash_map<std::basic_string_view<char>,_const_slang::syntax::SyntaxNode_*,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>_>
                .
                super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>_>
              );
    ska::detailv3::
    sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>_>
    ::~sherwood_v3_table
              (&local_210.instNames.
                super_flat_hash_map<std::basic_string_view<char>,_const_slang::syntax::SyntaxNode_*,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>_>
                .
                super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>_>
              );
    if (local_210.options.super_SmallVectorBase<slang::ast::CoverageOptionSetter>.data_ !=
        (pointer)local_210.options.super_SmallVectorBase<slang::ast::CoverageOptionSetter>.
                 firstElement) {
      free(local_210.options.super_SmallVectorBase<slang::ast::CoverageOptionSetter>.data_);
    }
    if (local_270[0].data_ != (pointer)local_270[0].firstElement) {
      free(local_270[0].data_);
    }
    return;
  }
  std::terminate();
}

Assistant:

void CoverCrossSymbol::fromSyntax(const Scope& scope, const CoverCrossSyntax& syntax,
                                  SmallVectorBase<const Symbol*>& results) {
    string_view name;
    SourceLocation loc;
    if (syntax.label) {
        name = syntax.label->name.valueText();
        loc = syntax.label->name.location();
    }
    else {
        loc = syntax.cross.location();
    }

    SmallVector<const CoverpointSymbol*> targets;
    for (auto item : syntax.items) {
        auto symbol = scope.find(item->identifier.valueText());
        if (symbol && symbol->kind == SymbolKind::Coverpoint) {
            targets.push_back(&symbol->as<CoverpointSymbol>());
        }
        else {
            // If we didn't find a coverpoint, create one implicitly
            // that will be initialized with this expression.
            auto& newPoint = CoverpointSymbol::fromImplicit(scope, *item);
            targets.push_back(&newPoint);
            results.push_back(&newPoint);
        }
    }

    auto& comp = scope.getCompilation();
    auto result = comp.emplace<CoverCrossSymbol>(comp, name, loc, targets.copy(comp));
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    auto body = comp.emplace<CoverCrossBodySymbol>(comp, loc);
    result->addMember(*body);

    StructBuilder valType(*body, LookupLocation::min);
    for (auto item : targets)
        valType.addField(item->name, item->declaredType);

    auto valType_t = comp.emplace<TypeAliasType>("CrossValType", loc);
    valType_t->targetType.setType(valType.type);
    body->addMember(*valType_t);

    auto queueType = comp.emplace<QueueType>(*valType_t, 0u);
    auto queueType_t = comp.emplace<TypeAliasType>("CrossQueueType", loc);
    queueType_t->targetType.setType(*queueType);
    body->addMember(*queueType_t);
    body->crossQueueType = queueType_t;

    OptionBuilder options(*result);
    for (auto member : syntax.members) {
        if (member->kind == SyntaxKind::CoverageOption)
            options.add(member->as<CoverageOptionSyntax>());
        else
            body->addMembers(*member);
    }

    result->options = options.get();
    results.push_back(result);
}